

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_utctm.cc
# Opt level: O0

int asn1_utctime_to_tm(tm *tm,ASN1_UTCTIME *d,int allow_timezone_offset)

{
  int iVar1;
  undefined1 local_38 [8];
  CBS cbs;
  int allow_timezone_offset_local;
  ASN1_UTCTIME *d_local;
  tm *tm_local;
  
  if (d->type == 0x17) {
    cbs.len._4_4_ = allow_timezone_offset;
    CBS_init((CBS *)local_38,d->data,(long)d->length);
    iVar1 = CBS_parse_utc_time((CBS *)local_38,tm,cbs.len._4_4_);
    if (iVar1 == 0) {
      tm_local._4_4_ = 0;
    }
    else {
      tm_local._4_4_ = 1;
    }
  }
  else {
    tm_local._4_4_ = 0;
  }
  return tm_local._4_4_;
}

Assistant:

int asn1_utctime_to_tm(struct tm *tm, const ASN1_UTCTIME *d,
                       int allow_timezone_offset) {
  if (d->type != V_ASN1_UTCTIME) {
    return 0;
  }
  CBS cbs;
  CBS_init(&cbs, d->data, (size_t)d->length);
  if (!CBS_parse_utc_time(&cbs, tm, allow_timezone_offset)) {
    return 0;
  }
  return 1;
}